

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O1

void __thiscall
Assimp::LoadRequest::LoadRequest
          (LoadRequest *this,string *_file,uint _flags,PropertyMap *_map,uint _id)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  (this->file)._M_dataplus._M_p = (pointer)&(this->file).field_2;
  pcVar2 = (_file->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + _file->_M_string_length);
  this->flags = _flags;
  this->refCnt = 1;
  this->scene = (aiScene *)0x0;
  this->loaded = false;
  p_Var1 = &(this->map).ints._M_t._M_impl.super__Rb_tree_header;
  (this->map).ints._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map).ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->map).ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->map).ints._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->map).ints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->map).floats._M_t._M_impl.super__Rb_tree_header;
  (this->map).floats._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map).floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->map).floats._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->map).floats._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->map).floats._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->map).strings._M_t._M_impl.super__Rb_tree_header;
  (this->map).strings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map).strings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->map).strings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->map).strings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->map).strings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->map).matrices._M_t._M_impl.super__Rb_tree_header;
  (this->map).matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map).matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->map).matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->map).matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->map).matrices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->id = _id;
  if (_map != (PropertyMap *)0x0) {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
    ::operator=((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                 *)&this->map,
                (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                 *)_map);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
    ::operator=(&(this->map).floats._M_t,&(_map->floats)._M_t);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(&(this->map).strings._M_t,&(_map->strings)._M_t);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
    ::operator=(&(this->map).matrices._M_t,&(_map->matrices)._M_t);
  }
  return;
}

Assistant:

LoadRequest(const std::string& _file, unsigned int _flags,const BatchLoader::PropertyMap* _map, unsigned int _id)
        : file(_file)
        , flags(_flags)
        , refCnt(1)
        , scene(NULL)
        , loaded(false)
        , id(_id) {
            if ( _map ) {
                map = *_map;
            }
        }